

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cpp
# Opt level: O0

void __thiscall iu_ProdTest_x_iutest_x_Peep_Test::Body(iu_ProdTest_x_iutest_x_Peep_Test *this)

{
  bool bVar1;
  char *message;
  AssertionHelper local_210;
  Fixed local_1e0;
  int local_44;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  ProdClass c;
  iu_ProdTest_x_iutest_x_Peep_Test *this_local;
  
  ProdClass::ProdClass((ProdClass *)&iutest_ar.field_0x24);
  iutest::detail::AlwaysZero();
  local_44 = 100;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_40,"100",
             "(c.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass> >::value)",&local_44,
             (int *)(&iutest_ar.field_0x24 +
                    iutest::detail::peep_tag<iu_peep_tag_m_x<ProdClass>>::value));
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/simple.cpp"
               ,0x9f,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST(ProdTest, Peep)
{
    ProdClass c;
    IUTEST_ASSERT_EQ(100, IUTEST_PEEP_GET(c, ProdClass, m_x));
}